

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heapmap.cpp
# Opt level: O1

void test3(void)

{
  bool bVar1;
  HeapMap<int,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  *pHVar2;
  LinkedNode *pLVar3;
  ostream *poVar4;
  __hashtable *__h;
  void *local_48;
  undefined8 *local_40;
  int local_34;
  
  pHVar2 = TinyGC::
           MakeGarbageCollected<HeapMap<int,LinkedNode,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>
                     (tg);
  local_34 = 0;
  do {
    local_48 = (void *)0x0;
    pLVar3 = TinyGC::MakeGarbageCollected<LinkedNode,decltype(nullptr),int&>(tg,&local_48,&local_34)
    ;
    local_40 = (undefined8 *)operator_new(8);
    *local_40 = pLVar3;
    local_48 = (void *)CONCAT44(local_48._4_4_,local_34);
    std::
    _Hashtable<int,std::pair<int_const,Member<LinkedNode>*>,std::allocator<std::pair<int_const,Member<LinkedNode>*>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<int_const,Member<LinkedNode>*>>
              ((_Hashtable<int,std::pair<int_const,Member<LinkedNode>*>,std::allocator<std::pair<int_const,Member<LinkedNode>*>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&pHVar2->map_,&local_48);
    std::__detail::
    _Map_base<int,_std::pair<const_int,_Member<LinkedNode>_*>,_std::allocator<std::pair<const_int,_Member<LinkedNode>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::at((_Map_base<int,_std::pair<const_int,_Member<LinkedNode>_*>,_std::allocator<std::pair<const_int,_Member<LinkedNode>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          *)&pHVar2->map_,&local_34);
    poVar4 = std::ostream::_M_insert<void_const*>(&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    bVar1 = local_34 < 9;
    local_34 = local_34 + 1;
  } while (bVar1);
  return;
}

Assistant:

void test3() {
  HeapMap<int, LinkedNode> *p =
      MakeGarbageCollected<HeapMap<int, LinkedNode>>();
  for (int id = 0; id < 10; id++) {
    auto t = MakeGarbageCollected<LinkedNode>(nullptr, id);
    p->insert(id, t);
    // p->erase(id);
    std::cout << p->at(id) << std::endl;
  }
}